

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamReaderPrivate::LoadNextAlignment
          (BamReaderPrivate *this,BamAlignment *alignment)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  RaiiBuffer *this_00;
  long in_RSI;
  value_type *in_RDI;
  uint i_1;
  CigarOp op;
  uint32_t *cigarData;
  uint cigarDataOffset;
  RaiiBuffer allCharData;
  uint dataLength;
  bool readCharDataOK;
  uint tempValue;
  uint i;
  char x [32];
  char buffer [4];
  char *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff74;
  uint32_t uVar4;
  undefined4 in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  long lVar5;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_ffffffffffffff90;
  BgzfStream *in_stack_ffffffffffffff98;
  bool local_51;
  byte bStack_4f;
  undefined2 uStack_4e;
  uint local_4c;
  bool local_1;
  
  std::fill_n<char*,unsigned_long,int>
            (in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
             ,(int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  BgzfStream::Read(in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  uVar1 = UnpackUnsignedInt((char *)0x1aed24);
  *(uint *)(in_RSI + 0x120) = uVar1;
  if ((in_RDI[8].Type & 1U) != 0) {
    SwapEndian_32((uint32_t *)(in_RSI + 0x120));
  }
  if (*(int *)(in_RSI + 0x120) == 0) {
    local_1 = false;
  }
  else {
    sVar3 = BgzfStream::Read(in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (sVar3 == 0x20) {
      if ((in_RDI[8].Type & 1U) != 0) {
        for (local_4c = 0; local_4c < 0x20; local_4c = local_4c + 4) {
          SwapEndian_32p(in_stack_ffffffffffffff60);
        }
      }
      iVar2 = UnpackSignedInt((char *)0x1aede8);
      *(int *)(in_RSI + 0xa8) = iVar2;
      iVar2 = UnpackSignedInt((char *)0x1aee02);
      *(int *)(in_RSI + 0xac) = iVar2;
      uVar1 = UnpackUnsignedInt((char *)0x1aee1c);
      uStack_4e = (undefined2)(uVar1 >> 0x10);
      *(undefined2 *)(in_RSI + 0xb0) = uStack_4e;
      bStack_4f = (byte)(uVar1 >> 8);
      *(ushort *)(in_RSI + 0xb2) = (ushort)bStack_4f;
      *(uint *)(in_RSI + 0x128) = uVar1 & 0xff;
      uVar1 = UnpackUnsignedInt((char *)0x1aee68);
      *(uint *)(in_RSI + 0xb4) = uVar1 >> 0x10;
      *(uint *)(in_RSI + 0x124) = uVar1 & 0xffff;
      uVar1 = UnpackUnsignedInt((char *)0x1aee9c);
      *(uint *)(in_RSI + 300) = uVar1;
      iVar2 = UnpackSignedInt((char *)0x1aeeb6);
      *(int *)(in_RSI + 0xd0) = iVar2;
      iVar2 = UnpackSignedInt((char *)0x1aeed0);
      *(int *)(in_RSI + 0xd4) = iVar2;
      iVar2 = UnpackSignedInt((char *)0x1aeeea);
      *(int *)(in_RSI + 0xd8) = iVar2;
      *(undefined4 *)(in_RSI + 0x20) = *(undefined4 *)(in_RSI + 300);
      local_51 = false;
      iVar2 = *(int *)(in_RSI + 0x120);
      RaiiBuffer::RaiiBuffer
                ((RaiiBuffer *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (size_t)in_RDI);
      this_00 = (RaiiBuffer *)
                BgzfStream::Read(in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (this_00 == (RaiiBuffer *)(ulong)(iVar2 - 0x20)) {
        std::__cxx11::string::assign((char *)(in_RSI + 0x100),(ulong)in_stack_ffffffffffffff98);
        local_51 = true;
        uVar1 = *(uint *)(in_RSI + 0x128);
        lVar5 = (long)&in_stack_ffffffffffffff98->m_blockLength + (ulong)uVar1;
        uVar4 = 0;
        CigarOp::CigarOp((CigarOp *)&stack0xffffffffffffff78,'\0',
                         (uint32_t *)&stack0xffffffffffffff74);
        std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::clear
                  ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)0x1aefe2);
        std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::reserve
                  (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,uVar1));
        for (uVar1 = 0; uVar1 < *(uint *)(in_RSI + 0x124); uVar1 = uVar1 + 1) {
          if ((in_RDI[8].Type & 1U) != 0) {
            SwapEndian_32((uint32_t *)(lVar5 + (ulong)uVar1 * 4));
          }
          std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::push_back
                    ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                     CONCAT44(uVar4,uVar1),in_RDI);
        }
      }
      local_1 = local_51;
      RaiiBuffer::~RaiiBuffer(this_00);
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool BamReaderPrivate::LoadNextAlignment(BamAlignment& alignment) {

    // read in the 'block length' value, make sure it's not zero
    char buffer[sizeof(uint32_t)];
    fill_n(buffer, sizeof(uint32_t), 0);
    m_stream.Read(buffer, sizeof(uint32_t));
    alignment.SupportData.BlockLength = BamTools::UnpackUnsignedInt(buffer);
    if ( m_isBigEndian ) BamTools::SwapEndian_32(alignment.SupportData.BlockLength);
    if ( alignment.SupportData.BlockLength == 0 )
        return false;

    // read in core alignment data, make sure the right size of data was read
    char x[Constants::BAM_CORE_SIZE];
    if ( m_stream.Read(x, Constants::BAM_CORE_SIZE) != Constants::BAM_CORE_SIZE )
        return false;

    // swap core endian-ness if necessary
    if ( m_isBigEndian ) {
        for ( unsigned int i = 0; i < Constants::BAM_CORE_SIZE; i+=sizeof(uint32_t) )
            BamTools::SwapEndian_32p(&x[i]);
    }

    // set BamAlignment 'core' and 'support' data
    alignment.RefID    = BamTools::UnpackSignedInt(&x[0]);
    alignment.Position = BamTools::UnpackSignedInt(&x[4]);

    unsigned int tempValue = BamTools::UnpackUnsignedInt(&x[8]);
    alignment.Bin        = tempValue >> 16;
    alignment.MapQuality = tempValue >> 8 & 0xff;
    alignment.SupportData.QueryNameLength = tempValue & 0xff;

    tempValue = BamTools::UnpackUnsignedInt(&x[12]);
    alignment.AlignmentFlag = tempValue >> 16;
    alignment.SupportData.NumCigarOperations = tempValue & 0xffff;

    alignment.SupportData.QuerySequenceLength = BamTools::UnpackUnsignedInt(&x[16]);
    alignment.MateRefID    = BamTools::UnpackSignedInt(&x[20]);
    alignment.MatePosition = BamTools::UnpackSignedInt(&x[24]);
    alignment.InsertSize   = BamTools::UnpackSignedInt(&x[28]);

    // set BamAlignment length
    alignment.Length = alignment.SupportData.QuerySequenceLength;

    // read in character data - make sure proper data size was read
    bool readCharDataOK = false;
    const unsigned int dataLength = alignment.SupportData.BlockLength - Constants::BAM_CORE_SIZE;
    RaiiBuffer allCharData(dataLength);

    if ( m_stream.Read(allCharData.Buffer, dataLength) == dataLength ) {

        // store 'allCharData' in supportData structure
        alignment.SupportData.AllCharData.assign((const char*)allCharData.Buffer, dataLength);

        // set success flag
        readCharDataOK = true;

        // save CIGAR ops
        // need to calculate this here so that  BamAlignment::GetEndPosition() performs correctly,
        // even when GetNextAlignmentCore() is called
        const unsigned int cigarDataOffset = alignment.SupportData.QueryNameLength;
        uint32_t* cigarData = (uint32_t*)(allCharData.Buffer + cigarDataOffset);
        CigarOp op;
        alignment.CigarData.clear();
        alignment.CigarData.reserve(alignment.SupportData.NumCigarOperations);
        for ( unsigned int i = 0; i < alignment.SupportData.NumCigarOperations; ++i ) {

            // swap endian-ness if necessary
            if ( m_isBigEndian ) BamTools::SwapEndian_32(cigarData[i]);

            // build CigarOp structure
            op.Length = (cigarData[i] >> Constants::BAM_CIGAR_SHIFT);
            op.Type   = Constants::BAM_CIGAR_LOOKUP[ (cigarData[i] & Constants::BAM_CIGAR_MASK) ];

            // save CigarOp
            alignment.CigarData.push_back(op);
        }
    }

    // return success/failure
    return readCharDataOK;
}